

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMatrixCorotation.cpp
# Opt level: O3

void chrono::fea::ChMatrixCorotation::ComputeCK
               (ChMatrixConstRef K,ChMatrix33<double> *R,int nblocks,ChMatrixRef *CK)

{
  undefined1 auVar1 [16];
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong *puVar9;
  long lVar10;
  ulong uVar11;
  double *pdVar12;
  long lVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  ulong local_50;
  
  uVar7 = 0;
  if (0 < nblocks) {
    lVar2 = (K->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_cols.m_value;
    lVar10 = 0;
    local_50 = 0;
    uVar6 = (uint)lVar2;
    do {
      uVar5 = (K->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).
              super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
              .m_rows.m_value;
      if ((long)uVar5 <= (long)uVar7) {
        uVar5 = uVar7;
      }
      if (0 < (int)uVar6) {
        lVar13 = 0;
        uVar11 = 0;
        do {
          lVar4 = 0;
          pdVar12 = (double *)R;
          do {
            if (lVar2 <= (long)uVar11 || uVar5 - uVar7 < 3) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x77,
                            "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, 0>::operator()(Index, Index) const [Derived = Eigen::Ref<const Eigen::Matrix<double, -1, -1, 1>>, Level = 0]"
                           );
            }
            lVar3 = (K->
                    super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                    ).m_stride.m_outer.m_value;
            auVar14 = ZEXT864(0) << 0x40;
            puVar9 = (ulong *)((long)(K->
                                     super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                     ).
                                     super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                                     .m_data + lVar10 * lVar3 + lVar13);
            lVar8 = 0;
            do {
              auVar15._8_8_ = 0;
              auVar15._0_8_ = pdVar12[lVar8];
              lVar8 = lVar8 + 1;
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *puVar9;
              auVar1 = vfmadd231sd_fma(auVar14._0_16_,auVar15,auVar1);
              auVar14 = ZEXT1664(auVar1);
              puVar9 = puVar9 + lVar3;
            } while (lVar8 != 3);
            lVar3 = lVar4 + local_50 * 3;
            if (((CK->
                 super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                 ).
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                 .
                 super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                 .m_rows.m_value <= lVar3) ||
               ((CK->
                super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                ).
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
                .
                super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
                .m_cols.m_value <= (long)uVar11)) {
              __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                            "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                            "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, 1>::operator()(Index, Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, -1, 1>>, Level = 1]"
                           );
            }
            lVar4 = lVar4 + 1;
            pdVar12 = pdVar12 + 3;
            (CK->
            super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>
            .
            super_MapBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
            .m_data[uVar11 + lVar3 * (CK->
                                     super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
                                     ).m_stride.m_outer.m_value] = auVar1._0_8_;
          } while (lVar4 != 3);
          uVar11 = uVar11 + 1;
          lVar13 = lVar13 + 8;
        } while (uVar11 != (~((int)uVar6 >> 0x1f) & uVar6));
      }
      lVar10 = lVar10 + 0x18;
      local_50 = local_50 + 1;
      uVar7 = (ulong)((int)uVar7 + 3);
    } while (local_50 != (uint)nblocks);
  }
  return;
}

Assistant:

void ChMatrixCorotation::ComputeCK(ChMatrixConstRef K,     // matrix to corotate
                                   const ChMatrix33<>& R,  // 3x3 rotation matrix
                                   const int nblocks,      // number of rotation blocks
                                   ChMatrixRef CK          // result matrix: C*K
) {
    for (int iblock = 0; iblock < nblocks; iblock++) {
        double sum;
        for (int colres = 0; colres < (int)K.cols(); ++colres)
            for (int row = 0; row < 3; ++row) {
                sum = 0;
                for (int col = 0; col < 3; ++col)
                    sum += R(row, col) * K((3 * iblock) + col, colres);
                CK((3 * iblock) + row, colres) = sum;
            }
    }
}